

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

QSystemError createDirectoryWithParents(QByteArray *path,mode_t mode)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  QSystemError QVar7;
  ulong size;
  ulong uVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  QByteArray local_d8;
  stat64 local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar9 = (path->d).ptr;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
  }
  iVar2 = mkdir(pcVar9,mode);
  if (iVar2 == 0) {
LAB_003c2cbd:
    uVar8 = 0;
    uVar3 = 0;
  }
  else {
    puVar4 = (uint *)__errno_location();
    uVar3 = *puVar4;
    if (uVar3 == 0x1e) {
LAB_003c2c7b:
      memset(&local_c0,0xaa,0x90);
      pcVar9 = (path->d).ptr;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "";
      }
      iVar2 = stat64(pcVar9,&local_c0);
      uVar8 = 0x100000000;
      if (iVar2 == 0) {
        uVar3 = 0x11;
        if ((local_c0.st_mode & 0xf000) == 0x4000) {
          uVar8 = 0;
          uVar3 = 0;
        }
      }
      else {
        uVar3 = *puVar4;
      }
    }
    else {
      if (uVar3 == 0x15) goto LAB_003c2cbd;
      if (uVar3 == 0x11) goto LAB_003c2c7b;
      uVar8 = 0x100000000;
    }
  }
  if (uVar8 == 0) {
    QVar7.errorScope = NoError;
    QVar7.errorCode = uVar3;
    goto LAB_003c2e73;
  }
  if (uVar3 != 2) {
    QVar7 = (QSystemError)(uVar8 | uVar3);
    goto LAB_003c2e73;
  }
  uVar5 = QByteArray::lastIndexOf(path,'/',-1);
  uVar1 = uVar5;
  do {
    uVar6 = uVar1;
    size = (long)uVar5 >> 0x3f & uVar5;
    if ((long)uVar6 < 1) break;
    uVar1 = uVar6 - 1;
    size = uVar6;
  } while ((path->d).ptr[uVar6 - 1] == '/');
  if ((long)size < 1) {
    QVar7 = (QSystemError)(uVar8 | 2);
    goto LAB_003c2e73;
  }
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_d8,(path->d).ptr,size);
  QVar7 = createDirectoryWithParents(&local_d8,mode);
  if ((ulong)QVar7 >> 0x20 == 0) {
    pcVar9 = (path->d).ptr;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    iVar2 = mkdir(pcVar9,mode);
    if (iVar2 == 0) {
LAB_003c2e1e:
      uVar8 = 0;
      uVar3 = 0;
    }
    else {
      puVar4 = (uint *)__errno_location();
      uVar3 = *puVar4;
      if (uVar3 == 0x1e) {
LAB_003c2dcf:
        memset(&local_c0,0xaa,0x90);
        pcVar9 = (path->d).ptr;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "";
        }
        iVar2 = stat64(pcVar9,&local_c0);
        uVar8 = 0x100000000;
        if (iVar2 == 0) {
          uVar3 = 0x11;
          if ((local_c0.st_mode & 0xf000) == 0x4000) {
            uVar8 = 0;
            uVar3 = 0;
          }
        }
        else {
          uVar3 = *puVar4;
        }
      }
      else {
        if (uVar3 == 0x15) goto LAB_003c2e1e;
        if (uVar3 == 0x11) goto LAB_003c2dcf;
        uVar8 = 0x100000000;
      }
    }
    QVar7 = (QSystemError)(uVar3 | uVar8);
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_003c2e73:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

static QSystemError createDirectoryWithParents(const QByteArray &path, mode_t mode)
{
#ifdef Q_OS_WASM
    if (path == "/")
        return {};
#endif

    auto tryMkDir = [&path, mode]() -> QSystemError {
        if (QT_MKDIR(path, mode) == 0) {
#ifdef Q_OS_VXWORKS
            forceRequestedPermissionsOnVxWorks(path, mode);
#endif
            return {};
        }
        // On macOS with APFS mkdir sets errno to EISDIR, QTBUG-97110
        if (errno == EISDIR)
            return {};
        if (errno == EEXIST || errno == EROFS) {
            // ::mkdir() can fail if the dir already exists (it may have been
            // created by another thread or another process)
            QT_STATBUF st;
            if (QT_STAT(path.constData(), &st) != 0)
                return QSystemError::stdError(errno);
            const bool isDir = (st.st_mode & S_IFMT) == S_IFDIR;
            return isDir ? QSystemError{} : QSystemError::stdError(EEXIST);
        }
        return QSystemError::stdError(errno);
    };

    QSystemError result = tryMkDir();
    if (result.ok())
        return result;

    // Only handle non-existing dir components in the path
    if (result.errorCode != ENOENT)
        return result;

    qsizetype slash = path.lastIndexOf('/');
    while (slash > 0 && path[slash - 1] == '/')
        --slash;

    if (slash < 1)
        return result;

    // mkdir failed because the parent dir doesn't exist, so try to create it
    QByteArray parentPath = path.first(slash);
    if (result = createDirectoryWithParents(parentPath, mode); !result.ok())
        return result;

    // try again
    return tryMkDir();
}